

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dutils.cc
# Opt level: O0

void print_group_info(GroupInfo *group_info)

{
  ostream *poVar1;
  GroupInfo *group_info_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Group: ");
  poVar1 = std::operator<<(poVar1,group_info->name);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::dec);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)group_info->name_length);
  poVar1 = std::operator<<(poVar1,") ");
  poVar1 = std::operator<<(poVar1,"ID ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)group_info->id);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,group_info->description);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)group_info->descr_length);
  poVar1 = std::operator<<(poVar1,") ");
  poVar1 = std::operator<<(poVar1,"next: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,group_info->next_offset);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print_group_info (const GroupInfo &group_info) {
	cout << "Group: " << group_info.name 
		<< "(" << dec << static_cast<int>(group_info.name_length) << ") "
		<< "ID " << static_cast<int>(group_info.id) << ": "
		<< group_info.description
		<< "(" << static_cast<int>(group_info.descr_length) <<") "
		<< "next: " << group_info.next_offset << endl;
}